

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdicc.c
# Opt level: O2

boolean marker_is_icc(jpeg_saved_marker_ptr_conflict marker)

{
  JOCTET *pJVar1;
  uint uVar2;
  
  uVar2 = 0;
  if (((((marker->marker == 0xe2) && (0xd < marker->data_length)) &&
       (pJVar1 = marker->data, *pJVar1 == 'I')) &&
      (((pJVar1[1] == 'C' && (pJVar1[2] == 'C')) &&
       ((pJVar1[3] == '_' && ((pJVar1[4] == 'P' && (pJVar1[5] == 'R')))))))) &&
     ((pJVar1[6] == 'O' &&
      ((((pJVar1[7] == 'F' && (pJVar1[8] == 'I')) && (pJVar1[9] == 'L')) && (pJVar1[10] == 'E'))))))
  {
    uVar2 = (uint)(pJVar1[0xb] == '\0');
  }
  return uVar2;
}

Assistant:

LOCAL(boolean)
marker_is_icc(jpeg_saved_marker_ptr marker)
{
  return
    marker->marker == ICC_MARKER &&
    marker->data_length >= ICC_OVERHEAD_LEN &&
    /* verify the identifying string */
    marker->data[0] == 0x49 &&
    marker->data[1] == 0x43 &&
    marker->data[2] == 0x43 &&
    marker->data[3] == 0x5F &&
    marker->data[4] == 0x50 &&
    marker->data[5] == 0x52 &&
    marker->data[6] == 0x4F &&
    marker->data[7] == 0x46 &&
    marker->data[8] == 0x49 &&
    marker->data[9] == 0x4C &&
    marker->data[10] == 0x45 &&
    marker->data[11] == 0x0;
}